

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (CompilerMSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,string *qualifier
          )

{
  bool bVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)1> id;
  uint32_t uVar3;
  SPIRType *pSVar4;
  char *pcVar5;
  CompilerError *pCVar6;
  SPIRType *pSVar7;
  bool member;
  undefined4 in_register_00000014;
  SPIRType *type_00;
  uint32_t index_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool local_98a;
  byte local_962;
  undefined1 local_8e8 [32];
  undefined1 local_8c8 [48];
  char *overlapping_binding_tag;
  spirv_cross local_878 [32];
  spirv_cross local_858 [32];
  undefined1 local_838 [40];
  SPIRType orig_type;
  string decl_type;
  SPIRType *local_698;
  SPIRType *data_type;
  undefined1 local_670 [32];
  undefined1 local_650 [64];
  undefined1 local_610 [64];
  undefined1 local_5d0 [64];
  uint32_t local_590;
  char local_589;
  undefined1 local_588 [8];
  SPIRType metallic_type;
  allocator local_41d;
  BuiltIn local_41c;
  string local_418 [4];
  BuiltIn builtin_1;
  bool local_3f5;
  BuiltIn local_3f4;
  string local_3f0 [3];
  bool is_ib_in_out;
  BuiltIn builtin;
  string array_type;
  ID local_3cc;
  __cxx11 local_3c8 [32];
  string local_3a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388 [32];
  __cxx11 local_368 [32];
  __cxx11 local_348 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [32];
  string local_2c8 [32];
  __cxx11 local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [39];
  allocator local_241;
  string local_240 [8];
  string td_line;
  allocator local_219;
  string local_218 [8];
  string base_type;
  uint local_1f4;
  uint local_1f0;
  uint32_t cols;
  uint32_t rows;
  SPIRType *declared_type;
  SPIRType row_major_physical_type;
  bool local_75;
  bool row_major;
  uint32_t local_64;
  string local_60 [4];
  uint32_t orig_id;
  string pack_pfx;
  SPIRType *physical_type;
  uint32_t orig_member_type_id;
  string *qualifier_local;
  uint32_t index_local;
  uint32_t member_type_id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *result;
  
  type_00 = (SPIRType *)CONCAT44(in_register_00000014,member_type_id);
  index_00 = (uint32_t)qualifier;
  bVar1 = CompilerGLSL::member_is_remapped_physical_type((CompilerGLSL *)type,type_00,index_00);
  qualifier_local._4_4_ = index;
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
    qualifier_local._4_4_ =
         Compiler::get_extended_member_decoration
                   ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationPhysicalTypeID);
  }
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,qualifier_local._4_4_);
  ::std::__cxx11::string::string(local_60);
  local_64 = 0;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
  bVar1 = Compiler::has_extended_member_decoration
                    ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationInterfaceOrigID);
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
    local_64 = Compiler::get_extended_member_decoration
                         ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationInterfaceOrigID);
  }
  local_75 = false;
  bVar1 = Compiler::is_matrix((Compiler *)type,pSVar4);
  if (bVar1) {
    row_major_physical_type.member_name_cache._M_h._M_single_bucket._4_4_ =
         TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
    local_75 = Compiler::has_member_decoration
                         ((Compiler *)type,
                          (TypeID)row_major_physical_type.member_name_cache._M_h._M_single_bucket.
                                  _4_4_,index_00,DecorationRowMajor);
  }
  SPIRType::SPIRType((SPIRType *)&declared_type,OpTypeMatrix);
  id = TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
  bVar1 = Compiler::has_member_decoration((Compiler *)type,(TypeID)id.id,index_00,DecorationOffset);
  if (bVar1) {
    *(undefined1 *)((long)&type[0x20].super_IVariant.self.id + 2) = 1;
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
    bVar1 = Compiler::has_extended_member_decoration
                      ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationResourceIndexPrimary);
    if (bVar1) {
      *(undefined1 *)((long)&type[0x20].super_IVariant.self.id + 2) = 1;
    }
  }
  bVar1 = CompilerGLSL::member_is_packed_physical_type((CompilerGLSL *)type,type_00,index_00);
  _rows = pSVar4;
  if (bVar1) {
    if (pSVar4->basetype == Struct) {
      pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar6,"Cannot emit a packed struct currently.");
      __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar1 = Compiler::is_matrix((Compiler *)type,pSVar4);
    if (bVar1) {
      local_1f0 = pSVar4->vecsize;
      local_1f4 = pSVar4->columns;
      ::std::__cxx11::string::operator=(local_60,"packed_");
      if (local_75 != false) {
        local_1f0 = pSVar4->columns;
        local_1f4 = pSVar4->vecsize;
        ::std::__cxx11::string::operator=(local_60,"packed_rm_");
      }
      pcVar5 = "float";
      if (pSVar4->width == 0x10) {
        pcVar5 = "half";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_218,pcVar5,&local_219);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_219);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_240,"typedef ",&local_241);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_241);
      ::std::operator+((char *)local_288,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x409992
                      );
      ::std::__cxx11::to_string(local_2a8,local_1f0);
      ::std::operator+(local_268,local_288);
      ::std::__cxx11::string::operator+=(local_240,(string *)local_268);
      ::std::__cxx11::string::~string((string *)local_268);
      ::std::__cxx11::string::~string((string *)local_2a8);
      ::std::__cxx11::string::~string((string *)local_288);
      ::std::operator+((char *)local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40c6cb
                      );
      ::std::__cxx11::string::operator+=(local_240,local_2c8);
      ::std::__cxx11::string::~string(local_2c8);
      ::std::__cxx11::to_string(local_348,pSVar4->columns);
      ::std::operator+(local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218);
      ::std::operator+(local_308,(char *)local_328);
      ::std::__cxx11::to_string(local_368,pSVar4->vecsize);
      ::std::operator+(local_2e8,local_308);
      ::std::__cxx11::string::operator+=(local_240,(string *)local_2e8);
      ::std::__cxx11::string::~string((string *)local_2e8);
      ::std::__cxx11::string::~string((string *)local_368);
      ::std::__cxx11::string::~string((string *)local_308);
      ::std::__cxx11::string::~string((string *)local_328);
      ::std::__cxx11::string::~string((string *)local_348);
      ::std::__cxx11::to_string(local_3c8,local_1f4);
      ::std::operator+((char *)local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40f992
                      );
      ::std::operator+(local_388,(char *)local_3a8);
      ::std::__cxx11::string::operator+=(local_240,(string *)local_388);
      ::std::__cxx11::string::~string((string *)local_388);
      ::std::__cxx11::string::~string(local_3a8);
      ::std::__cxx11::string::~string((string *)local_3c8);
      ::std::__cxx11::string::operator+=(local_240,";");
      add_typedef_line((CompilerMSL *)type,(string *)local_240);
      ::std::__cxx11::string::~string(local_240);
      ::std::__cxx11::string::~string(local_218);
    }
    else {
      bVar1 = Compiler::is_scalar((Compiler *)type,pSVar4);
      if (!bVar1) {
        ::std::__cxx11::string::operator=(local_60,"packed_");
      }
    }
  }
  else {
    bVar1 = Compiler::is_matrix((Compiler *)type,pSVar4);
    if (bVar1) {
      bVar1 = Options::supports_msl_version
                        ((Options *)
                         ((long)&type[0x1c].member_type_index_redirection.
                                 super_VectorView<unsigned_int>.ptr + 4),3,0,0);
      if (!bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        bVar1 = Compiler::has_extended_decoration
                          ((Compiler *)type,uVar2,SPIRVCrossDecorationWorkgroupStruct);
        if (bVar1) {
          ::std::__cxx11::string::operator=(local_60,"spvStorage_");
          add_spv_func_and_recompile((CompilerMSL *)type,SPVFuncImplStorageMatrix);
          *(undefined1 *)((long)&type[0x20].super_IVariant.self.id + 2) = 1;
        }
      }
      if (local_75 != false) {
        SPIRType::operator=((SPIRType *)&declared_type,pSVar4);
        ::std::swap<unsigned_int>(&row_major_physical_type.basetype,&row_major_physical_type.width);
        _rows = (SPIRType *)&declared_type;
      }
    }
  }
  local_962 = 0;
  if ((pSVar4->basetype == Image) && (local_962 = 0, (pSVar4->image).sampled == 2)) {
    bVar1 = Options::is_ios((Options *)
                            ((long)&type[0x1c].member_type_index_redirection.
                                    super_VectorView<unsigned_int>.ptr + 4));
    local_962 = 0;
    if ((bVar1) &&
       (local_962 = 0, *(int *)((long)&type[0x1c].member_name_cache._M_h._M_bucket_count + 4) < 1))
    {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_3cc,local_64);
      bVar1 = Compiler::has_decoration((Compiler *)type,local_3cc,DecorationNonWritable);
      local_962 = bVar1 ^ 0xff;
    }
  }
  if ((local_962 & 1) != 0) {
    pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar6,"Writable images are not allowed on Tier1 argument buffers on iOS.");
    __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  ::std::__cxx11::string::string(local_3f0);
  if (((pSVar4->basetype != Image) && (pSVar4->basetype != Sampler)) &&
     (pSVar4->basetype != SampledImage)) {
    local_3f4 = BuiltInMax;
    uVar2 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&type[0x1f].member_name_cache._M_h._M_before_begin);
    if (uVar2 == 0) {
LAB_002ea689:
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((long)&type[0x1f].member_name_cache._M_h._M_bucket_count + 4));
      if (uVar2 != 0) {
        pSVar7 = get_stage_in_struct_type((CompilerMSL *)type);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar7->super_IVariant).self);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        if (uVar2 == uVar3) {
          bVar1 = variable_storage_requires_stage_io((CompilerMSL *)type,StorageClassInput);
          local_98a = true;
          if (bVar1) goto LAB_002ea755;
        }
      }
      local_98a = is_mesh_shader((CompilerMSL *)type);
    }
    else {
      pSVar7 = get_stage_out_struct_type((CompilerMSL *)type);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar7->super_IVariant).self);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
      if (uVar2 != uVar3) goto LAB_002ea689;
      bVar1 = variable_storage_requires_stage_io((CompilerMSL *)type,StorageClassOutput);
      local_98a = true;
      if (!bVar1) goto LAB_002ea689;
    }
LAB_002ea755:
    local_3f5 = local_98a;
    if ((local_98a != false) &&
       (bVar1 = Compiler::is_member_builtin((Compiler *)type,type_00,index_00,&local_3f4), bVar1)) {
      *(undefined1 *)((long)&type[0x20].super_IVariant.self.id + 2) = 1;
    }
    (*(type->super_IVariant)._vptr_IVariant[0x27])(local_418,type,pSVar4,(ulong)local_64);
    ::std::__cxx11::string::operator=(local_3f0,local_418);
    ::std::__cxx11::string::~string(local_418);
  }
  bVar1 = is_mesh_shader((CompilerMSL *)type);
  member = SUB41(local_64,0);
  if (bVar1) {
    local_41c = BuiltInMax;
    bVar1 = Compiler::is_member_builtin((Compiler *)type,type_00,index_00,&local_41c);
    if (bVar1) {
      if (local_41c == BuiltInPrimitiveShadingRateKHR) {
        *(undefined1 *)((long)&type[0x20].super_IVariant.self.id + 2) = 0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_41d);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_41d);
        metallic_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
      }
      else {
        SPIRType::SPIRType((SPIRType *)local_588,_rows);
        if (local_41c == BuiltInCullPrimitiveEXT) {
          metallic_type.super_IVariant.self.id = 2;
        }
        else if (((local_41c == BuiltInPrimitiveId) || (local_41c == BuiltInLayer)) ||
                (local_41c == BuiltInViewportIndex)) {
          metallic_type.super_IVariant.self.id = 8;
        }
        *(undefined1 *)((long)&type[0x20].super_IVariant.self.id + 2) = 1;
        local_589 = '\0';
        ::std::__cxx11::string::string((string *)this);
        local_590 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
        bVar1 = Compiler::has_member_decoration
                          ((Compiler *)type,(TypeID)local_590,local_64,DecorationBuiltIn);
        if (bVar1) {
          type_to_glsl_abi_cxx11_((CompilerMSL *)local_5d0,type,(uint32_t)local_588,member);
          (*(type->super_IVariant)._vptr_IVariant[0x14])(local_610 + 0x20,type,(ulong)local_41c,3);
          member_attribute_qualifier_abi_cxx11_((CompilerMSL *)local_610,type,member_type_id);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    ((spirv_cross *)(local_5d0 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                     (char (*) [2])0x40c6cb,in_R9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_610 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0,
                     (char (*) [2])0x42463b);
          ::std::__cxx11::string::operator=((string *)this,(string *)(local_5d0 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_5d0 + 0x20));
          ::std::__cxx11::string::~string((string *)local_610);
          ::std::__cxx11::string::~string((string *)(local_610 + 0x20));
          ::std::__cxx11::string::~string((string *)local_5d0);
        }
        else {
          type_to_glsl_abi_cxx11_((CompilerMSL *)local_650,type,(uint32_t)local_588,member);
          CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_670,type,member_type_id);
          member_attribute_qualifier_abi_cxx11_((CompilerMSL *)&data_type,type,member_type_id);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    ((spirv_cross *)(local_650 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650,
                     (char (*) [2])0x40c6cb,in_R9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data_type
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0
                     ,(char (*) [2])0x42463b);
          ::std::__cxx11::string::operator=((string *)this,(string *)(local_650 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_650 + 0x20));
          ::std::__cxx11::string::~string((string *)&data_type);
          ::std::__cxx11::string::~string((string *)local_670);
          ::std::__cxx11::string::~string((string *)local_650);
        }
        *(undefined1 *)((long)&type[0x20].super_IVariant.self.id + 2) = 0;
        metallic_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
        local_589 = '\x01';
        SPIRType::~SPIRType((SPIRType *)local_588);
      }
      goto LAB_002eb121;
    }
  }
  if (local_64 != 0) {
    local_698 = _rows;
    bVar1 = Compiler::is_pointer((Compiler *)type,_rows);
    if (bVar1) {
      local_698 = Compiler::get_pointee_type((Compiler *)type,_rows);
    }
    bVar1 = Compiler::is_array((Compiler *)type,local_698);
    if ((bVar1) &&
       (uVar2 = get_resource_array_size((CompilerMSL *)type,local_698,local_64), uVar2 == 0)) {
      ::std::__cxx11::string::operator=(local_3f0,"[1] /* unsized array hack */");
    }
  }
  ::std::__cxx11::string::string((string *)&orig_type.member_name_cache._M_h._M_single_bucket);
  if (_rows->vecsize < 5) {
    type_to_glsl_abi_cxx11_((CompilerMSL *)&overlapping_binding_tag,type,(uint32_t)_rows,member);
    ::std::__cxx11::string::operator=
              ((string *)&orig_type.member_name_cache._M_h._M_single_bucket,
               (string *)&overlapping_binding_tag);
    ::std::__cxx11::string::~string((string *)&overlapping_binding_tag);
  }
  else {
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,index);
    SPIRType::SPIRType((SPIRType *)(local_838 + 0x20),pSVar4);
    bVar1 = Compiler::is_matrix((Compiler *)type,(SPIRType *)(local_838 + 0x20));
    if ((bVar1) && (local_75 != false)) {
      ::std::swap<unsigned_int>(&orig_type.basetype,&orig_type.width);
    }
    orig_type.width = 1;
    type_to_glsl_abi_cxx11_((CompilerMSL *)local_838,type,(int)local_838 + 0x20,member);
    ::std::__cxx11::string::operator=
              ((string *)&orig_type.member_name_cache._M_h._M_single_bucket,(string *)local_838);
    ::std::__cxx11::string::~string((string *)local_838);
    if (_rows->columns < 2) {
      join<char_const(&)[17],std::__cxx11::string&,char_const(&)[2]>
                (local_878,(char (*) [17])"spvPaddedStd140<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &orig_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x4222ea);
      ::std::__cxx11::string::operator=
                ((string *)&orig_type.member_name_cache._M_h._M_single_bucket,(string *)local_878);
      ::std::__cxx11::string::~string((string *)local_878);
    }
    else {
      join<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (local_858,(char (*) [23])"spvPaddedStd140Matrix<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &orig_type.member_name_cache._M_h._M_single_bucket,(char (*) [3])0x421228,
                 &_rows->columns,(char (*) [2])0x4222ea);
      ::std::__cxx11::string::operator=
                ((string *)&orig_type.member_name_cache._M_h._M_single_bucket,(string *)local_858);
      ::std::__cxx11::string::~string((string *)local_858);
    }
    SPIRType::~SPIRType((SPIRType *)(local_838 + 0x20));
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
  bVar1 = Compiler::has_extended_member_decoration
                    ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationOverlappingBinding);
  local_8c8._40_8_ = "";
  if (bVar1) {
    local_8c8._40_8_ = "// Overlapping binding: ";
  }
  local_8c8[0x27] = '\0';
  CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_8c8,type,member_type_id);
  member_attribute_qualifier_abi_cxx11_((CompilerMSL *)local_8e8,type,member_type_id);
  join<char_const*&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            ((spirv_cross *)this,(char **)(local_8c8 + 0x28),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &orig_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x40c6cb,in_R9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0,
             (char (*) [2])0x42463b);
  ::std::__cxx11::string::~string((string *)local_8e8);
  ::std::__cxx11::string::~string((string *)local_8c8);
  *(undefined1 *)((long)&type[0x20].super_IVariant.self.id + 2) = 0;
  metallic_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
  local_8c8[0x27] = '\x01';
  ::std::__cxx11::string::~string((string *)&orig_type.member_name_cache._M_h._M_single_bucket);
LAB_002eb121:
  ::std::__cxx11::string::~string(local_3f0);
  SPIRType::~SPIRType((SPIRType *)&declared_type);
  ::std::__cxx11::string::~string(local_60);
  return this;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	uint32_t orig_member_type_id = member_type_id;
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type { OpTypeMatrix };
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput))) ||
				is_mesh_shader();
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type, orig_id);
	}

	if (is_mesh_shader())
	{
		BuiltIn builtin = BuiltInMax;
		if (is_member_builtin(type, index, &builtin))
		{
			if (builtin == BuiltInPrimitiveShadingRateKHR)
			{
				// not supported in metal 3.0
				is_using_builtin_array = false;
				return "";
			}

			SPIRType metallic_type = *declared_type;
			if (builtin == BuiltInCullPrimitiveEXT)
				metallic_type.basetype = SPIRType::Boolean;
			else if (builtin == BuiltInPrimitiveId || builtin == BuiltInLayer || builtin == BuiltInViewportIndex)
				metallic_type.basetype = SPIRType::UInt;

			is_using_builtin_array = true;
			std::string result;
			if (has_member_decoration(type.self, orig_id, DecorationBuiltIn))
			{
				// avoid '_RESERVED_IDENTIFIER_FIXUP_' in variable name
				result = join(type_to_glsl(metallic_type, orig_id, false), " ", qualifier,
				              builtin_to_glsl(builtin, StorageClassOutput), member_attribute_qualifier(type, index),
				              array_type, ";");
			}
			else
			{
				result = join(type_to_glsl(metallic_type, orig_id, false), " ", qualifier,
				              to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");
			}
			is_using_builtin_array = false;
			return result;
		}
	}

	if (orig_id)
	{
		auto *data_type = declared_type;
		if (is_pointer(*data_type))
			data_type = &get_pointee_type(*data_type);

		if (is_array(*data_type) && get_resource_array_size(*data_type, orig_id) == 0)
		{
			// Hack for declaring unsized array of resources. Need to declare dummy sized array by value inline.
			// This can then be wrapped in spvDescriptorArray as usual.
			array_type = "[1] /* unsized array hack */";
		}
	}

	string decl_type;
	if (declared_type->vecsize > 4)
	{
		auto orig_type = get<SPIRType>(orig_member_type_id);
		if (is_matrix(orig_type) && row_major)
			swap(orig_type.vecsize, orig_type.columns);
		orig_type.columns = 1;
		decl_type = type_to_glsl(orig_type, orig_id, true);

		if (declared_type->columns > 1)
			decl_type = join("spvPaddedStd140Matrix<", decl_type, ", ", declared_type->columns, ">");
		else
			decl_type = join("spvPaddedStd140<", decl_type, ">");
	}
	else
		decl_type = type_to_glsl(*declared_type, orig_id, true);

	const char *overlapping_binding_tag =
			has_extended_member_decoration(type.self, index, SPIRVCrossDecorationOverlappingBinding) ?
			"// Overlapping binding: " : "";

	auto result = join(overlapping_binding_tag, pack_pfx, decl_type, " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}